

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O2

void __thiscall
ParamEntry::restoreXml(ParamEntry *this,Element *el,AddrSpaceManager *manage,bool normalstack)

{
  int iVar1;
  ParamEntry *pPVar2;
  bool bVar3;
  type_metatype tVar4;
  LowlevelError *pLVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar7;
  ulong uVar8;
  Address AVar9;
  allocator local_1e9;
  ParamEntry *local_1e8;
  int4 *local_1e0;
  int4 *local_1d8;
  undefined4 local_1cc;
  int4 *local_1c8;
  int4 *local_1c0;
  AddrSpaceManager *local_1b8;
  istringstream i1;
  uintb local_1a8;
  uint auStack_198 [90];
  
  local_1cc = (undefined4)CONCAT71(in_register_00000009,normalstack);
  this->flags = 0;
  this->type = TYPE_UNKNOWN;
  local_1e0 = &this->size;
  local_1d8 = &this->alignment;
  this->size = -1;
  this->minsize = -1;
  this->alignment = 0;
  this->numslots = 1;
  local_1c8 = &this->groupsize;
  this->groupsize = 1;
  uVar7 = (ulong)((long)(el->attr).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(el->attr).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  local_1c0 = &this->group;
  uVar8 = 0;
  uVar6 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar6 = uVar8;
  }
  local_1e8 = this;
  local_1b8 = manage;
  do {
    pPVar2 = local_1e8;
    if (uVar6 * 0x20 == uVar8) {
      if ((*local_1e0 == -1) || (this->minsize == -1)) {
        pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string((string *)&i1,"ParamEntry not fully specified",&local_1e9);
        LowlevelError::LowlevelError(pLVar5,(string *)&i1);
        __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      if (*local_1d8 == *local_1e0) {
        *local_1d8 = 0;
      }
      AVar9 = Address::restoreXml((Address *)&i1,
                                  *(el->children).
                                   super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl
                                   .super__Vector_impl_data._M_start,local_1b8);
      uVar6 = AVar9.offset;
      pPVar2->spaceid = (AddrSpace *)_i1;
      pPVar2->addressbase = local_1a8;
      iVar1 = pPVar2->alignment;
      if (iVar1 != 0) {
        uVar6 = (long)pPVar2->size % (long)iVar1 & 0xffffffff;
        pPVar2->numslots = pPVar2->size / iVar1;
      }
      if ((*(uint *)(_i1 + 0x24) & 0x10) != 0) {
        if ((*(uint *)(_i1 + 0x24) & 1) == 0) {
          pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20,_i1,uVar6);
          std::__cxx11::string::string
                    ((string *)&i1,"No support for right justification in little endian encoding",
                     &local_1e9);
          LowlevelError::LowlevelError(pLVar5,(string *)&i1);
          __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
        }
        *(byte *)&pPVar2->flags = (byte)pPVar2->flags | 1;
      }
      if ((((char)local_1cc == '\0') &&
          (*(byte *)&pPVar2->flags = (byte)pPVar2->flags | 2, iVar1 != 0)) &&
         (*local_1e0 % iVar1 != 0)) {
        pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string
                  ((string *)&i1,"For positive stack growth, <pentry> size must match alignment",
                   &local_1e9);
        LowlevelError::LowlevelError(pLVar5,(string *)&i1);
        __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      resolveJoin(pPVar2);
      return;
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(((el->attr).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8);
    bVar3 = std::operator==(__lhs,"minsize");
    if (bVar3) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&i1,
                 (string *)
                 ((long)&(((el->value).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8),
                 _S_in);
      *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) =
           *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) & 0xffffffb5;
      std::istream::operator>>((istringstream *)&i1,&this->minsize);
LAB_002917f5:
      std::__cxx11::istringstream::~istringstream((istringstream *)&i1);
    }
    else {
      bVar3 = std::operator==(__lhs,"size");
      if (bVar3) {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&i1,
                   (string *)
                   ((long)&(((el->value).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8),
                   _S_in);
        *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) =
             *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) & 0xffffffb5;
        std::istream::operator>>((istringstream *)&i1,local_1d8);
        goto LAB_002917f5;
      }
      bVar3 = std::operator==(__lhs,"align");
      if (bVar3) {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&i1,
                   (string *)
                   ((long)&(((el->value).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8),
                   _S_in);
        *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) =
             *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) & 0xffffffb5;
        std::istream::operator>>((istringstream *)&i1,local_1d8);
        goto LAB_002917f5;
      }
      bVar3 = std::operator==(__lhs,"maxsize");
      if (bVar3) {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&i1,
                   (string *)
                   ((long)&(((el->value).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8),
                   _S_in);
        *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) =
             *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) & 0xffffffb5;
        std::istream::operator>>((istringstream *)&i1,local_1e0);
        goto LAB_002917f5;
      }
      bVar3 = std::operator==(__lhs,"metatype");
      if (!bVar3) {
        bVar3 = std::operator==(__lhs,"group");
        if (bVar3) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&i1,
                     (string *)
                     ((long)&(((el->value).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8
                     ),_S_in);
          *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) =
               *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) & 0xffffffb5;
          std::istream::operator>>((istringstream *)&i1,local_1c0);
        }
        else {
          bVar3 = std::operator==(__lhs,"groupsize");
          if (!bVar3) {
            bVar3 = std::operator==(__lhs,"extension");
            pPVar2 = local_1e8;
            if (!bVar3) {
              pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &i1,"Unknown ParamEntry attribute: ",__lhs);
              LowlevelError::LowlevelError(pLVar5,(string *)&i1);
              __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
            }
            *(byte *)&local_1e8->flags = (byte)local_1e8->flags & 0xd3;
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&(((el->value).
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + uVar8),"sign");
            if (bVar3) {
              *(byte *)&pPVar2->flags = (byte)pPVar2->flags | 8;
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&(((el->value).
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + uVar8),"zero");
              if (bVar3) {
                *(byte *)&local_1e8->flags = (byte)local_1e8->flags | 4;
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&(((el->value).
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + uVar8),"inttype");
                if (bVar3) {
                  *(byte *)&local_1e8->flags = (byte)local_1e8->flags | 0x20;
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&(((el->value).
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + uVar8),"float");
                  if (bVar3) {
                    *(byte *)&local_1e8->flags = (byte)local_1e8->flags | 0x40;
                  }
                  else {
                    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&(((el->value).
                                                                                                                  
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + uVar8),"none");
                    if (bVar3) {
                      pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
                      std::__cxx11::string::string
                                ((string *)&i1,"Bad extension attribute",&local_1e9);
                      LowlevelError::LowlevelError(pLVar5,(string *)&i1);
                      __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
                    }
                  }
                }
              }
            }
            goto LAB_002917fd;
          }
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&i1,
                     (string *)
                     ((long)&(((el->value).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8
                     ),_S_in);
          *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) =
               *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) & 0xffffffb5;
          std::istream::operator>>((istringstream *)&i1,local_1c8);
        }
        goto LAB_002917f5;
      }
      tVar4 = string2metatype((string *)
                              ((long)&(((el->value).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + uVar8));
      local_1e8->type = tVar4;
    }
LAB_002917fd:
    uVar8 = uVar8 + 0x20;
  } while( true );
}

Assistant:

void ParamEntry::restoreXml(const Element *el,const AddrSpaceManager *manage,bool normalstack)

{
  flags = 0;
  type = TYPE_UNKNOWN;
  size = minsize = -1;		// Must be filled in
  alignment = 0;		// default
  numslots = 1;
  groupsize = 1;		// default
  int4 num = el->getNumAttributes();
  
  for(int4 i=0;i<num;++i) {
    const string &attrname( el->getAttributeName(i) );
    if (attrname=="minsize") {
      istringstream i1(el->getAttributeValue(i));
      i1.unsetf(ios::dec | ios::hex | ios::oct);
      i1 >> minsize;
    }
    else if (attrname == "size") { // old style
      istringstream i2(el->getAttributeValue(i));
      i2.unsetf(ios::dec | ios::hex | ios::oct);
      i2 >> alignment;
    }
    else if (attrname == "align") { // new style
      istringstream i4(el->getAttributeValue(i));
      i4.unsetf(ios::dec | ios::hex | ios::oct);
      i4 >> alignment;
    }
    else if (attrname == "maxsize") {
      istringstream i3(el->getAttributeValue(i));
      i3.unsetf(ios::dec | ios::hex | ios::oct);
      i3 >> size;
    }
    else if (attrname == "metatype")
      type = string2metatype(el->getAttributeValue(i));
    else if (attrname == "group") { // Override the group
      istringstream i5(el->getAttributeValue(i));
      i5.unsetf(ios::dec | ios::hex | ios::oct);
      i5 >> group;
    }
    else if (attrname == "groupsize") {
      istringstream i6(el->getAttributeValue(i));
      i6.unsetf(ios::dec | ios::hex | ios::oct);
      i6 >> groupsize;
    }
    else if (attrname == "extension") {
      flags &= ~((uint4)(smallsize_zext | smallsize_sext | smallsize_inttype));
      if (el->getAttributeValue(i) == "sign")
	flags |= smallsize_sext;
      else if (el->getAttributeValue(i) == "zero")
	flags |= smallsize_zext;
      else if (el->getAttributeValue(i) == "inttype")
	flags |= smallsize_inttype;
      else if (el->getAttributeValue(i) == "float")
	flags |= smallsize_floatext;
      else if (el->getAttributeValue(i) != "none")
	throw LowlevelError("Bad extension attribute");
    }
    else
      throw LowlevelError("Unknown ParamEntry attribute: "+attrname);
  }
  if ((size==-1)||(minsize==-1))
    throw LowlevelError("ParamEntry not fully specified");
  if (alignment == size)
    alignment = 0;
  Address addr;
  addr = Address::restoreXml( *el->getChildren().begin(),manage);
  spaceid = addr.getSpace();
  addressbase = addr.getOffset();
  if (alignment != 0) {
//    if ((addressbase % alignment) != 0)
//      throw LowlevelError("Stack <pentry> address must match alignment");
    numslots = size / alignment;
  }
  if (spaceid->isReverseJustified()) {
    if (spaceid->isBigEndian())
      flags |= force_left_justify;
    else
      throw LowlevelError("No support for right justification in little endian encoding");
  }
  if (!normalstack) {
    flags |= reverse_stack;
    if (alignment != 0) {
      if ((size % alignment) != 0)
	throw LowlevelError("For positive stack growth, <pentry> size must match alignment");
    }
  }
  resolveJoin();
}